

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

Instr * __thiscall IR::Instr::ShareBailOut(Instr *this)

{
  code *pcVar1;
  bool bVar2;
  BailOutInfo *bailOutInfo_00;
  BailOutInstrTemplate<IR::Instr> *this_00;
  undefined4 *puVar3;
  Instr *sharedBail;
  BailOutInfo *bailOutInfo;
  Instr *this_local;
  
  bailOutInfo_00 = GetBailOutInfo(this);
  bailOutInfo_00->bailOutInstr = (Instr *)0x0;
  bailOutInfo_00->wasCopied = true;
  this_00 = BailOutInstrTemplate<IR::Instr>::New
                      (BailTarget,BailOutShared,bailOutInfo_00,bailOutInfo_00->bailOutFunc);
  SetByteCodeOffset(&this_00->super_Instr,this);
  InsertAfter(this,&this_00->super_Instr);
  if ((BailOutInstrTemplate<IR::Instr> *)bailOutInfo_00->bailOutInstr != this_00) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x521,"(bailOutInfo->bailOutInstr == sharedBail)",
                       "bailOutInfo->bailOutInstr == sharedBail");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return &this_00->super_Instr;
}

Assistant:

IR::Instr *Instr::ShareBailOut()
{
    BailOutInfo *const bailOutInfo = GetBailOutInfo();
    bailOutInfo->bailOutInstr = nullptr;
#if DBG
    bailOutInfo->wasCopied = true;
#endif
    IR::Instr *const sharedBail =
        IR::BailOutInstr::New(Js::OpCode::BailTarget, IR::BailOutShared, bailOutInfo, bailOutInfo->bailOutFunc);
    sharedBail->SetByteCodeOffset(this);
    InsertAfter(sharedBail);
    Assert(bailOutInfo->bailOutInstr == sharedBail);
    return sharedBail;
}